

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.cpp
# Opt level: O3

string * hashBlockToHex_abi_cxx11_(HashBlock block)

{
  long lVar1;
  int i;
  long lVar2;
  string *in_RDI;
  stringstream stream;
  stringstream local_1b8 [16];
  long local_1a8 [3];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  lVar2 = 0;
  do {
    lVar1 = 0;
    do {
      lVar1 = lVar1 + -1;
    } while (lVar1 != -4);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x40);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return in_RDI;
}

Assistant:

std::string hashBlockToHex(HashBlock block) {
    ByteBitSet c;
    std::stringstream stream;

    for (int i = 0; i < HASH_OUTPUT_SEGMENT_SIZE * 2; i++) {
        for (int j = 0; j < CHAR_SIZE_BIT / 2; j++) {
            c[(CHAR_SIZE_BIT / 2) - 1 - j] = block[HASH_OUTPUT_SIZE - 1 - (i * CHAR_SIZE_BIT / 2) - j];
        }

        stream << std::hex << c.to_ulong();

    }


    return stream.str();
}